

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O3

TCHAR * CombinePath(TCHAR *szDirectory,TCHAR *szSubDir)

{
  long lVar1;
  size_t __n;
  size_t sVar2;
  TCHAR *__dest;
  size_t __n_00;
  TCHAR *__dest_00;
  char *__s;
  
  if (szDirectory != (TCHAR *)0x0) {
    for (__n = strlen(szDirectory); __n != 0; __n = __n - 1) {
      if ((szDirectory[__n - 1] != '\\') && (szDirectory[__n - 1] != '/')) goto LAB_0010b351;
    }
  }
  __n = 0;
LAB_0010b351:
  if (szSubDir == (TCHAR *)0x0) {
    __s = (char *)0x0;
LAB_0010b387:
    __n_00 = 0;
  }
  else {
    do {
      __s = szSubDir;
      szSubDir = __s + 1;
    } while (*__s == '/');
    sVar2 = strlen(__s);
    sVar2 = sVar2 + 1;
    do {
      if (sVar2 == 1) goto LAB_0010b387;
      __n_00 = sVar2 - 1;
      lVar1 = sVar2 - 2;
      sVar2 = __n_00;
    } while (__s[lVar1] == '/');
  }
  __dest = (TCHAR *)malloc(__n + __n_00 + 2);
  if (__dest != (TCHAR *)0x0) {
    __dest_00 = __dest;
    if (__n != 0 && szDirectory != (TCHAR *)0x0) {
      memcpy(__dest,szDirectory,__n);
      __dest_00 = __dest + __n;
    }
    if ((__s != (char *)0x0) && (__n_00 != 0)) {
      if (__dest < __dest_00) {
        *__dest_00 = '/';
        __dest_00 = __dest_00 + 1;
      }
      memcpy(__dest_00,__s,__n_00);
      __dest_00 = __dest_00 + __n_00;
    }
    *__dest_00 = '\0';
  }
  return __dest;
}

Assistant:

TCHAR * CombinePath(const TCHAR * szDirectory, const TCHAR * szSubDir)
{
    TCHAR * szFullPath = NULL;
    TCHAR * szPathPtr;
    size_t nLength1 = 0;
    size_t nLength2 = 0;

    // Calculate lengths of each part
    if(szDirectory != NULL)
    {
        // Get the length of the directory
        nLength1 = _tcslen(szDirectory);

        // Cut all ending backslashes
        while(nLength1 > 0 && (szDirectory[nLength1 - 1] == _T('\\') || szDirectory[nLength1 - 1] == _T('/')))
            nLength1--;
    }

    if(szSubDir != NULL)
    {
        // Cut all leading backslashes
        while(szSubDir[0] == _T(PATH_SEP_CHAR))
            szSubDir++;

        // Get the length of the subdir
        nLength2 = _tcslen(szSubDir);

        // Cut all ending backslashes
        while(nLength2 > 0 && szSubDir[nLength2 - 1] == _T(PATH_SEP_CHAR))
            nLength2--;
    }

    // Allocate space for the full path
    szFullPath = szPathPtr = CASC_ALLOC(TCHAR, nLength1 + nLength2 + 2);
    if(szFullPath != NULL)
    {
        // Copy the directory
        if(szDirectory != NULL && nLength1 != 0)
        {
            memcpy(szPathPtr, szDirectory, (nLength1 * sizeof(TCHAR)));
            szPathPtr += nLength1;
        }

        // Copy the sub-directory
        if(szSubDir != NULL && nLength2 != 0)
        {
            // Append backslash to the previous one
            if(szPathPtr > szFullPath)
                *szPathPtr++ = _T(PATH_SEP_CHAR);

            // Copy the string
            memcpy(szPathPtr, szSubDir, (nLength2 * sizeof(TCHAR)));
            szPathPtr += nLength2;
        }

        // Terminate the string
        szPathPtr[0] = 0;
    }

    return szFullPath;
}